

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_construct(void)

{
  _Bool _Var1;
  int iVar2;
  bitset_t *b;
  short sVar3;
  size_t sVar4;
  
  b = bitset_create();
  for (sVar4 = 0; sVar4 != 3000; sVar4 = sVar4 + 3) {
    bitset_set(b,sVar4);
  }
  iVar2 = compute_cardinality(b);
  _assert_true((ulong)(iVar2 == 1000),"compute_cardinality(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x52);
  sVar4 = bitset_count(b);
  _assert_true((ulong)(sVar4 == 1000),"bitset_count(b) == 1000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x53);
  sVar3 = 0;
  for (sVar4 = 0; sVar4 != 3000; sVar4 = sVar4 + 1) {
    _Var1 = bitset_get(b,sVar4);
    _assert_true((ulong)(((ushort)(((ushort)sVar4 / 3) * 3 + sVar3) != 0) != _Var1),
                 "bitset_get(b, k) == (k / 3 * 3 == k)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                 ,0x55);
    sVar3 = sVar3 + -1;
  }
  bitset_free(b);
  return;
}

Assistant:

DEFINE_TEST(test_construct) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(compute_cardinality(b) == 1000);
    assert_true(bitset_count(b) == 1000);
    for (int k = 0; k < 3 * 1000; ++k)
        assert_true(bitset_get(b, k) == (k / 3 * 3 == k));
    bitset_free(b);
}